

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::Detail::StringMakerBase<true>::convert<bsim::dynamic_bit_vector>
                   (string *__return_storage_ptr__,dynamic_bit_vector *_value)

{
  char *pcVar1;
  uint uVar2;
  ostringstream oss;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  if (0 < _value->N) {
    uVar2 = _value->N + 1;
    do {
      pcVar1 = "0";
      if (((_value->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2 - 2 >> 3] >> (uVar2 - 2 & 7) & 1) != 0) {
        pcVar1 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,pcVar1,1);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }